

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

string * pybind11::detail::error_string_abi_cxx11_(void)

{
  undefined8 *puVar1;
  uint __val;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  handle *handle;
  PyObject *pPVar6;
  long *plVar7;
  undefined8 *puVar8;
  char *pcVar9;
  long *plVar10;
  ulong *puVar11;
  ulong uVar12;
  size_type *psVar13;
  uint __len;
  undefined8 uVar14;
  string *in_RDI;
  PyTypeObject *pPVar15;
  size_type __dnew;
  string __str;
  error_scope scope;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  undefined1 local_168 [24];
  object oStack_150;
  undefined8 *local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  ulong *local_128;
  long local_120;
  ulong local_118 [2];
  ulong *local_108;
  long local_100;
  ulong local_f8;
  long lStack_f0;
  error_scope local_e8;
  string *local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  ulong *local_a8;
  long local_a0;
  ulong local_98;
  long lStack_90;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  handle local_60;
  handle local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar5 = PyErr_Occurred();
  if (lVar5 == 0) {
    PyErr_SetString(_PyExc_RuntimeError,"Unknown internal error occurred");
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    local_188._M_dataplus._M_p = (pointer)0x1f;
    pcVar9 = (char *)std::__cxx11::string::_M_create((ulong *)in_RDI,(ulong)&local_188);
    (in_RDI->_M_dataplus)._M_p = pcVar9;
    (in_RDI->field_2)._M_allocated_capacity = (size_type)local_188._M_dataplus._M_p;
    builtin_strncpy(pcVar9,"Unknown internal error occurred",0x1f);
    in_RDI->_M_string_length = (size_type)local_188._M_dataplus._M_p;
    local_188._M_dataplus._M_p[(long)(in_RDI->_M_dataplus)._M_p] = '\0';
  }
  else {
    PyErr_Fetch(&local_e8,&local_e8.value,&local_e8.trace);
    local_68 = &in_RDI->field_2;
    (in_RDI->_M_dataplus)._M_p = (pointer)local_68;
    in_RDI->_M_string_length = 0;
    (in_RDI->field_2)._M_local_buf[0] = '\0';
    local_d0 = in_RDI;
    if (local_e8.type != (PyObject *)0x0) {
      local_168._8_8_ = local_e8.type;
      local_168._16_8_ = "__name__";
      oStack_150.super_handle.m_ptr = (handle)(PyObject *)0x0;
      handle = &accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                          ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_168)->
                super_handle;
      cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_188,handle);
      std::__cxx11::string::_M_append((char *)in_RDI,(ulong)local_188._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p);
      }
      object::~object(&oStack_150);
      std::__cxx11::string::append((char *)in_RDI);
    }
    if (local_e8.value != (PyObject *)0x0) {
      local_168._0_8_ = PyObject_Str();
      str::operator_cast_to_string(&local_188,(str *)local_168);
      std::__cxx11::string::_M_append((char *)in_RDI,(ulong)local_188._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p);
      }
      object::~object((object *)local_168);
    }
    PyErr_NormalizeException(&local_e8,&local_e8.value,&local_e8.trace);
    if (local_e8.trace != (PyObject *)0x0) {
      PyException_SetTraceback(local_e8.value);
    }
    if (local_e8.trace != (PyObject *)0x0) {
      do {
        pPVar6 = local_e8.trace;
        local_e8.trace = (PyObject *)pPVar6[1].ob_refcnt;
      } while (local_e8.trace != (PyObject *)0x0);
      pPVar15 = pPVar6[1].ob_type;
      std::__cxx11::string::append((char *)in_RDI);
      if (pPVar15 != (PyTypeObject *)0x0) {
        do {
          uVar3 = PyFrame_GetLineNumber(pPVar15);
          local_58.m_ptr = *(PyObject **)(pPVar15->tp_basicsize + 0x68);
          cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_50,&local_58);
          plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x12014e);
          plVar10 = plVar7 + 2;
          if ((long *)*plVar7 == plVar10) {
            local_78 = *plVar10;
            lStack_70 = plVar7[3];
            local_88 = &local_78;
          }
          else {
            local_78 = *plVar10;
            local_88 = (long *)*plVar7;
          }
          local_80 = plVar7[1];
          *plVar7 = (long)plVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_88);
          puVar11 = (ulong *)(plVar7 + 2);
          if ((ulong *)*plVar7 == puVar11) {
            local_f8 = *puVar11;
            lStack_f0 = plVar7[3];
            local_108 = &local_f8;
          }
          else {
            local_f8 = *puVar11;
            local_108 = (ulong *)*plVar7;
          }
          local_100 = plVar7[1];
          *plVar7 = (long)puVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          __val = -uVar3;
          if (0 < (int)uVar3) {
            __val = uVar3;
          }
          __len = 1;
          if (9 < __val) {
            uVar12 = (ulong)__val;
            uVar2 = 4;
            do {
              __len = uVar2;
              uVar4 = (uint)uVar12;
              if (uVar4 < 100) {
                __len = __len - 2;
                goto LAB_0010f56f;
              }
              if (uVar4 < 1000) {
                __len = __len - 1;
                goto LAB_0010f56f;
              }
              if (uVar4 < 10000) goto LAB_0010f56f;
              uVar12 = uVar12 / 10000;
              uVar2 = __len + 4;
            } while (99999 < uVar4);
            __len = __len + 1;
          }
LAB_0010f56f:
          local_128 = local_118;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_128,(char)-((int)uVar3 >> 0x1f) + (char)__len);
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((ulong)(uint)-((int)uVar3 >> 0x1f) + (long)local_128),__len,__val);
          in_RDI = local_d0;
          uVar12 = 0xf;
          if (local_108 != &local_f8) {
            uVar12 = local_f8;
          }
          if (uVar12 < (ulong)(local_120 + local_100)) {
            uVar12 = 0xf;
            if (local_128 != local_118) {
              uVar12 = local_118[0];
            }
            if (uVar12 < (ulong)(local_120 + local_100)) goto LAB_0010f605;
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,(ulong)local_108)
            ;
          }
          else {
LAB_0010f605:
            puVar8 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_128);
          }
          local_148 = &local_138;
          puVar1 = puVar8 + 2;
          if ((undefined8 *)*puVar8 == puVar1) {
            local_138 = *puVar1;
            uStack_130 = puVar8[3];
          }
          else {
            local_138 = *puVar1;
            local_148 = (undefined8 *)*puVar8;
          }
          local_140 = puVar8[1];
          *puVar8 = puVar1;
          puVar8[1] = 0;
          *(undefined1 *)puVar1 = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_148);
          puVar11 = (ulong *)(plVar7 + 2);
          if ((ulong *)*plVar7 == puVar11) {
            local_98 = *puVar11;
            lStack_90 = plVar7[3];
            local_a8 = &local_98;
          }
          else {
            local_98 = *puVar11;
            local_a8 = (ulong *)*plVar7;
          }
          local_a0 = plVar7[1];
          *plVar7 = (long)puVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          local_60.m_ptr = *(PyObject **)(pPVar15->tp_basicsize + 0x70);
          cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_c8,&local_60);
          uVar12 = 0xf;
          if (local_a8 != &local_98) {
            uVar12 = local_98;
          }
          if (uVar12 < local_c8._M_string_length + local_a0) {
            uVar14 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              uVar14 = local_c8.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar14 < local_c8._M_string_length + local_a0) goto LAB_0010f749;
            plVar7 = (long *)std::__cxx11::string::replace
                                       ((ulong)&local_c8,0,(char *)0x0,(ulong)local_a8);
          }
          else {
LAB_0010f749:
            plVar7 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_a8,(ulong)local_c8._M_dataplus._M_p);
          }
          local_168._0_8_ = local_168 + 0x10;
          pPVar6 = (PyObject *)(plVar7 + 2);
          if ((PyObject *)*plVar7 == pPVar6) {
            local_168._16_8_ = pPVar6->ob_refcnt;
            oStack_150.super_handle.m_ptr = (handle)plVar7[3];
          }
          else {
            local_168._16_8_ = pPVar6->ob_refcnt;
            local_168._0_8_ = (PyObject *)*plVar7;
          }
          local_168._8_8_ = plVar7[1];
          *plVar7 = (long)pPVar6;
          plVar7[1] = 0;
          *(undefined1 *)&pPVar6->ob_refcnt = 0;
          plVar7 = (long *)std::__cxx11::string::append(local_168);
          local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
          psVar13 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13) {
            local_188.field_2._M_allocated_capacity = *psVar13;
            local_188.field_2._8_8_ = plVar7[3];
          }
          else {
            local_188.field_2._M_allocated_capacity = *psVar13;
            local_188._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_188._M_string_length = plVar7[1];
          *plVar7 = (long)psVar13;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::string::_M_append((char *)in_RDI,(ulong)local_188._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p);
          }
          if ((PyObject *)local_168._0_8_ != (PyObject *)(local_168 + 0x10)) {
            operator_delete((void *)local_168._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p);
          }
          if (local_a8 != &local_98) {
            operator_delete(local_a8);
          }
          if (local_148 != &local_138) {
            operator_delete(local_148);
          }
          if (local_128 != local_118) {
            operator_delete(local_128);
          }
          if (local_108 != &local_f8) {
            operator_delete(local_108);
          }
          if (local_88 != &local_78) {
            operator_delete(local_88);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          pPVar15 = (PyTypeObject *)pPVar15->tp_name;
        } while (pPVar15 != (PyTypeObject *)0x0);
      }
    }
    error_scope::~error_scope(&local_e8);
  }
  return in_RDI;
}

Assistant:

PYBIND11_NOINLINE inline std::string error_string() {
    if (!PyErr_Occurred()) {
        PyErr_SetString(PyExc_RuntimeError, "Unknown internal error occurred");
        return "Unknown internal error occurred";
    }

    error_scope scope; // Preserve error state

    std::string errorString;
    if (scope.type) {
        errorString += handle(scope.type).attr("__name__").cast<std::string>();
        errorString += ": ";
    }
    if (scope.value)
        errorString += (std::string) str(scope.value);

    PyErr_NormalizeException(&scope.type, &scope.value, &scope.trace);

#if PY_MAJOR_VERSION >= 3
    if (scope.trace != nullptr)
        PyException_SetTraceback(scope.value, scope.trace);
#endif

#if !defined(PYPY_VERSION)
    if (scope.trace) {
        PyTracebackObject *trace = (PyTracebackObject *) scope.trace;

        /* Get the deepest trace possible */
        while (trace->tb_next)
            trace = trace->tb_next;

        PyFrameObject *frame = trace->tb_frame;
        errorString += "\n\nAt:\n";
        while (frame) {
            int lineno = PyFrame_GetLineNumber(frame);
            errorString +=
                "  " + handle(frame->f_code->co_filename).cast<std::string>() +
                "(" + std::to_string(lineno) + "): " +
                handle(frame->f_code->co_name).cast<std::string>() + "\n";
            frame = frame->f_back;
        }
    }
#endif

    return errorString;
}